

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

int http_CloseHttpConnection(void *Handle)

{
  http_connection_handle_t *handle;
  void *Handle_local;
  
  if (Handle == (void *)0x0) {
    Handle_local._4_4_ = -0x65;
  }
  else {
    sock_destroy((SOCKINFO *)Handle,2);
    httpmsg_destroy((http_message_t *)((long)Handle + 0x90));
    free(Handle);
    Handle_local._4_4_ = 0;
  }
  return Handle_local._4_4_;
}

Assistant:

int http_CloseHttpConnection(void *Handle)
{
	http_connection_handle_t *handle = Handle;
	if (!handle)
		return UPNP_E_INVALID_PARAM;
	/*should shutdown completely */
	sock_destroy(&handle->sock_info, SD_BOTH);
	httpmsg_destroy(&handle->response.msg);
	free(handle);
	return UPNP_E_SUCCESS;
}